

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O2

void __thiscall
ByteData160_BytesConstructorException_Test::~ByteData160_BytesConstructorException_Test
          (ByteData160_BytesConstructorException_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData160, BytesConstructorException) {
  try {
    std::vector<uint8_t> target(25);
    ByteData160 byte_data = ByteData160(target);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "ByteData160 size unmatch.");
    return;
  }
  ASSERT_TRUE(false);
}